

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O3

bool duckdb::ClampSlice<duckdb::string_t,long,duckdb::StringSliceOperations>
               (string_t *value,long *begin,long *end)

{
  int64_t iVar1;
  int64_t iVar2;
  long lVar3;
  long lVar4;
  
  if (*begin == 0) {
    *begin = 0;
  }
  else {
    *begin = *begin + -1;
  }
  iVar2 = StringSliceOperations::ValueLength(value);
  lVar3 = *begin;
  if (SBORROW8(iVar2,-lVar3) == iVar2 + lVar3 < 0 || -1 < lVar3) {
    if (-1 < lVar3) goto LAB_01bac55b;
    iVar1 = iVar2 + 1 + lVar3;
LAB_01bac56b:
    lVar3 = iVar1;
    *begin = lVar3;
  }
  else {
    lVar4 = *end;
    *begin = 0;
    lVar3 = 0;
    if (lVar4 < 0 && SBORROW8(lVar4,-iVar2) != lVar4 + iVar2 < 0) goto LAB_01bac596;
LAB_01bac55b:
    iVar1 = iVar2;
    if (iVar2 < lVar3) goto LAB_01bac56b;
  }
  lVar4 = *end;
  if (lVar4 < 0) {
    iVar2 = iVar2 + lVar4 + 1;
LAB_01bac586:
    *end = iVar2;
    lVar3 = *begin;
    lVar4 = iVar2;
  }
  else if (iVar2 < lVar4) goto LAB_01bac586;
  if (lVar3 <= lVar4) {
    lVar3 = lVar4;
  }
LAB_01bac596:
  *end = lVar3;
  return SUB81(iVar2,0);
}

Assistant:

static bool ClampSlice(const INPUT_TYPE &value, INDEX_TYPE &begin, INDEX_TYPE &end) {
	// Clamp offsets
	begin = (begin != 0 && begin != (INDEX_TYPE)NumericLimits<int64_t>::Minimum()) ? begin - 1 : begin;

	bool is_min = false;
	if (begin == (INDEX_TYPE)NumericLimits<int64_t>::Minimum()) {
		begin++;
		is_min = true;
	}

	const auto length = OP::ValueLength(value);
	if (begin < 0 && -begin > length && end < 0 && end < -length) {
		begin = 0;
		end = 0;
		return true;
	}
	if (begin < 0 && -begin > length) {
		begin = 0;
	}
	ClampIndex(begin, value, length, is_min);
	ClampIndex(end, value, length, false);
	end = MaxValue<INDEX_TYPE>(begin, end);

	return true;
}